

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VWAP.cpp
# Opt level: O0

void __thiscall VWAPOption::computePrice(VWAPOption *this,ofstream *file)

{
  ostream *poVar1;
  void *pvVar2;
  type tVar3;
  type tVar4;
  double dVar5;
  cpu_timer local_e0 [40];
  undefined8 local_b8 [2];
  double local_a8;
  double local_a0;
  double VWAP_T;
  int i;
  undefined1 local_88 [8];
  accumulator_set<double,_stats<tag::mean,_tag::variance_(immediate)>_> price;
  timer t;
  ofstream *file_local;
  VWAPOption *this_local;
  
  boost::timer::auto_cpu_timer::auto_cpu_timer
            ((auto_cpu_timer *)&price.accumulators.cdr.cdr.cdr.field_0x8,6);
  boost::accumulators::
  accumulator_set<double,_boost::accumulators::stats<boost::accumulators::tag::mean,_boost::accumulators::tag::variance_(boost::accumulators::immediate),_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
  ::accumulator_set((accumulator_set<double,_boost::accumulators::stats<boost::accumulators::tag::mean,_boost::accumulators::tag::variance_(boost::accumulators::immediate),_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
                     *)local_88);
  for (VWAP_T._0_4_ = 0; VWAP_T._0_4_ < this->NPaths_; VWAP_T._0_4_ = VWAP_T._0_4_ + 1) {
    local_a0 = simulateSinglePath(this);
    if (local_a0 - this->K_ <= 0.0) {
      local_b8[0] = 0;
      boost::accumulators::
      accumulator_set<double,boost::accumulators::stats<boost::accumulators::tag::mean,boost::accumulators::tag::variance(boost::accumulators::immediate),mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
      ::operator()((accumulator_set<double,boost::accumulators::stats<boost::accumulators::tag::mean,boost::accumulators::tag::variance(boost::accumulators::immediate),mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
                    *)local_88,local_b8);
    }
    else {
      local_a8 = local_a0 - this->K_;
      boost::accumulators::
      accumulator_set<double,boost::accumulators::stats<boost::accumulators::tag::mean,boost::accumulators::tag::variance(boost::accumulators::immediate),mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
      ::operator()((accumulator_set<double,boost::accumulators::stats<boost::accumulators::tag::mean,boost::accumulators::tag::variance(boost::accumulators::immediate),mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
                    *)local_88,&local_a8);
    }
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"computation time = ");
  boost::timer::cpu_timer::format_abi_cxx11_(local_e0,(short)&price + 0x20);
  poVar1 = std::operator<<(poVar1,(string *)local_e0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_e0);
  poVar1 = std::operator<<((ostream *)&std::cout,"sigmaPrice = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->sigmaPrice_);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"price = ");
  tVar3 = boost::accumulators::extractor<boost::accumulators::tag::mean>::operator()
                    ((extractor<boost::accumulators::tag::mean> *)
                     &boost::accumulators::extract::mean,
                     (accumulator_set<double,_boost::accumulators::stats<boost::accumulators::tag::moment<1>,_boost::accumulators::tag::moment<2>,_boost::accumulators::tag::moment<3>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
                      *)local_88);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,tVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"stdDevPrice = ");
  tVar4 = boost::accumulators::extractor<boost::accumulators::tag::variance>::operator()
                    ((extractor<boost::accumulators::tag::variance> *)
                     &boost::accumulators::extract::variance,
                     (accumulator_set<double,_boost::accumulators::stats<boost::accumulators::tag::moment<1>,_boost::accumulators::tag::moment<2>,_boost::accumulators::tag::moment<3>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
                      *)local_88);
  dVar5 = sqrt(tVar4);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar5);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(file,this->sigmaPrice_);
  poVar1 = std::operator<<(poVar1,", ");
  tVar3 = boost::accumulators::extractor<boost::accumulators::tag::mean>::operator()
                    ((extractor<boost::accumulators::tag::mean> *)
                     &boost::accumulators::extract::mean,
                     (accumulator_set<double,_boost::accumulators::stats<boost::accumulators::tag::moment<1>,_boost::accumulators::tag::moment<2>,_boost::accumulators::tag::moment<3>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
                      *)local_88);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,tVar3);
  poVar1 = std::operator<<(poVar1,", ");
  tVar4 = boost::accumulators::extractor<boost::accumulators::tag::variance>::operator()
                    ((extractor<boost::accumulators::tag::variance> *)
                     &boost::accumulators::extract::variance,
                     (accumulator_set<double,_boost::accumulators::stats<boost::accumulators::tag::moment<1>,_boost::accumulators::tag::moment<2>,_boost::accumulators::tag::moment<3>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
                      *)local_88);
  dVar5 = sqrt(tVar4);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar5);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  boost::timer::auto_cpu_timer::~auto_cpu_timer
            ((auto_cpu_timer *)&price.accumulators.cdr.cdr.cdr.field_0x8);
  return;
}

Assistant:

void VWAPOption::computePrice(ofstream& file) {
    timer t;
    accumulator_set<double, stats<tag::mean, tag::variance(immediate) > > price;

    //compute estimate for VWAP price
    for (int i = 0; i < NPaths_; ++i) {
        double VWAP_T = simulateSinglePath();
        if((VWAP_T - K_ ) > 0)
        {
            price(VWAP_T - K_);
        }
        else
        {
            price(0.0);
        }
    }
    cout << std::endl;
    cout << "computation time = " << t.format(3) << std::endl;
    cout << "sigmaPrice = " << sigmaPrice_ << std::endl;
    cout << "price = " << mean(price) << std::endl;
    cout << "stdDevPrice = " << sqrt(variance(price)) << std::endl;

    file << sigmaPrice_
         << ", "
         << mean(price) //option price
         << ", "
         << sqrt(variance(price)) << std::endl;

}